

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

Node * __thiscall czh::parser::Parser::parse(Node *__return_storage_ptr__,Parser *this)

{
  Token *this_00;
  TokenType TVar1;
  undefined8 extraout_RAX;
  allocator<char> local_81;
  source_location local_80;
  Token local_78;
  
  if (this->curr_node == (Node *)0x0) {
    node::Node::reset(&this->node);
    this->curr_node = &this->node;
    lexer::Lexer::reset(this->lex);
  }
  get(&local_78,this);
  this_00 = &this->curr_tok;
  token::Token::operator=(this_00,&local_78);
  token::Token::~Token(&local_78);
  TVar1 = (this->curr_tok).type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Unexpected end of czh.",&local_81);
  local_80._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00195328;
  czh::error::czh_assert(TVar1 != FEND,(string *)&local_78,&local_80);
  std::__cxx11::string::~string((string *)&local_78);
LAB_00116593:
  do {
    if (this->lex->is_eof != false) {
LAB_001165e9:
      this->curr_node = (Node *)0x0;
      node::Node::Node(__return_storage_ptr__,&this->node);
      return __return_storage_ptr__;
    }
    TVar1 = this_00->type;
    if (TVar1 != ID) {
      if (TVar1 == SEND) {
        get(&local_78,this);
        token::Token::operator=(this_00,&local_78);
        token::Token::~Token(&local_78);
      }
      else {
        if (TVar1 != SCEND) {
          if (TVar1 != FEND) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_78,"Unexpected token",&local_81);
            local_80._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00195340;
            czh::error::czh_unreachable((string *)&local_78,&local_80);
            std::__cxx11::string::~string((string *)&local_78);
            _Unwind_Resume(extraout_RAX);
          }
          goto LAB_001165e9;
        }
        parse_end(this);
      }
      goto LAB_00116593;
    }
    parse_id(this);
  } while( true );
}

Assistant:

node::Node parse()
    {
      if (curr_node == nullptr)
      {
        node.reset();
        curr_node = &node;
        lex->reset();
      }
      curr_tok = get();
      error::czh_assert(curr_tok.type != token::TokenType::FEND, "Unexpected end of czh.");
      while (check())
      {
        switch (curr_tok.type)
        {
          case token::TokenType::ID:
            parse_id();
            break;
          case token::TokenType::SCEND:
            parse_end();
            break;
          case token::TokenType::SEND:
            curr_tok = get();
            break;
          case token::TokenType::FEND:
            curr_node = nullptr;
            return std::move(node);
          default:
            error::czh_unreachable("Unexpected token");
            break;
        }
      }
      curr_node = nullptr;
      return std::move(node);
    }